

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UnicodeString *
icu_63::TimeZone::formatCustomID
          (int32_t hour,int32_t min,int32_t sec,UBool negative,UnicodeString *id)

{
  UnicodeString *id_local;
  UBool negative_local;
  int32_t sec_local;
  int32_t min_local;
  int32_t hour_local;
  
  UnicodeString::setTo(id,L"GMT",3);
  if ((hour != 0 || min != 0) || sec != 0) {
    if (negative == '\0') {
      UnicodeString::operator+=(id,L'+');
    }
    else {
      UnicodeString::operator+=(id,L'-');
    }
    if (hour < 10) {
      UnicodeString::operator+=(id,L'0');
    }
    else {
      UnicodeString::operator+=(id,(short)(hour / 10) + L'0');
    }
    UnicodeString::operator+=(id,(short)(hour % 10) + L'0');
    UnicodeString::operator+=(id,L':');
    if (min < 10) {
      UnicodeString::operator+=(id,L'0');
    }
    else {
      UnicodeString::operator+=(id,(short)(min / 10) + L'0');
    }
    UnicodeString::operator+=(id,(short)(min % 10) + L'0');
    if (sec != 0) {
      UnicodeString::operator+=(id,L':');
      if (sec < 10) {
        UnicodeString::operator+=(id,L'0');
      }
      else {
        UnicodeString::operator+=(id,(short)(sec / 10) + L'0');
      }
      UnicodeString::operator+=(id,(short)(sec % 10) + L'0');
    }
  }
  return id;
}

Assistant:

UnicodeString&
TimeZone::formatCustomID(int32_t hour, int32_t min, int32_t sec,
                         UBool negative, UnicodeString& id) {
    // Create time zone ID - GMT[+|-]hhmm[ss]
    id.setTo(GMT_ID, GMT_ID_LENGTH);
    if (hour | min | sec) {
        if (negative) {
            id += (UChar)MINUS;
        } else {
            id += (UChar)PLUS;
        }

        if (hour < 10) {
            id += (UChar)ZERO_DIGIT;
        } else {
            id += (UChar)(ZERO_DIGIT + hour/10);
        }
        id += (UChar)(ZERO_DIGIT + hour%10);
        id += (UChar)COLON;
        if (min < 10) {
            id += (UChar)ZERO_DIGIT;
        } else {
            id += (UChar)(ZERO_DIGIT + min/10);
        }
        id += (UChar)(ZERO_DIGIT + min%10);

        if (sec) {
            id += (UChar)COLON;
            if (sec < 10) {
                id += (UChar)ZERO_DIGIT;
            } else {
                id += (UChar)(ZERO_DIGIT + sec/10);
            }
            id += (UChar)(ZERO_DIGIT + sec%10);
        }
    }
    return id;
}